

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmon.cpp
# Opt level: O2

void __thiscall
netmon::read_raw_network_stats_test
          (netmon *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
          *stats,string *read_path)

{
  int iVar1;
  pointer pbVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  pointer __k;
  pointer ppVar5;
  bool bVar6;
  unsigned_long_long value_read;
  string net_fname;
  parameter local_298;
  ifstream net_stream;
  
  iVar1 = read_raw_network_stats_test::iteration + 1;
  bVar6 = read_raw_network_stats_test::iteration == 0;
  read_raw_network_stats_test::iteration = iVar1;
  if (bVar6) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
    ::clear(&(this->net_stats)._M_t);
    ppVar3 = (this->params).super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (ppVar5 = (this->params).
                  super__Vector_base<prmon::parameter,_std::allocator<prmon::parameter>_>._M_impl.
                  super__Vector_impl_data._M_start; ppVar5 != ppVar3; ppVar5 = ppVar5 + 1) {
      std::__cxx11::string::string((string *)&net_fname,(string *)ppVar5);
      prmon::parameter::parameter(&local_298,ppVar5);
      prmon::monitored_value::monitored_value((monitored_value *)&net_stream,&local_298,true,0);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
      ::_M_emplace_unique<std::__cxx11::string_const,prmon::monitored_value>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,prmon::monitored_value>,std::_Select1st<std::pair<std::__cxx11::string_const,prmon::monitored_value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
                  *)&this->net_stats,&net_fname,(monitored_value *)&net_stream);
      prmon::parameter::~parameter((parameter *)&net_stream);
      prmon::parameter::~parameter(&local_298);
      std::__cxx11::string::~string((string *)&net_fname);
    }
  }
  pbVar2 = (this->interface_params).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (this->interface_params).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar2; __k = __k + 1) {
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[](stats,__k);
    *pmVar4 = 0;
    std::operator+(&net_fname,read_path,__k);
    std::ifstream::ifstream(&net_stream,(string *)&net_fname,_S_in);
    std::istream::_M_extract<unsigned_long_long>((ulonglong *)&net_stream);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[](stats,__k);
    *pmVar4 = *pmVar4;
    std::ifstream::~ifstream(&net_stream);
    std::__cxx11::string::~string((string *)&net_fname);
  }
  return;
}

Assistant:

void netmon::read_raw_network_stats_test(
    std::map<std::string, unsigned long long>& stats,
    const std::string& read_path) {
  static int iteration = 0;
  ++iteration;
  if (iteration == 1) {
    // Reset all net_stats initialised in constructor to 0 for testing
    net_stats.clear();
    for (const auto& param : params) {
      net_stats.emplace(param.get_name(),
                        prmon::monitored_value(param, true, 0));
    }
  }
  for (const auto& if_param : interface_params) {
    unsigned long long value_read{};
    stats[if_param] = 0;
    std::string net_fname = read_path + if_param;
    std::ifstream net_stream(net_fname);
    net_stream >> value_read;
    stats[if_param] += value_read;
  }
}